

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_feb727::CTransactionSignatureSerializer<CTransaction>::
SerializeOutput<HashWriter>
          (CTransactionSignatureSerializer<CTransaction> *this,HashWriter *s,uint nOutput)

{
  int in_EDX;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  CTxOut *in_stack_ffffffffffffff78;
  size_type in_stack_ffffffffffffff80;
  CTxOut local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(byte *)(in_RDI + 0x15) & 1) == 0) || (in_EDX == *(int *)(in_RDI + 0x10))) {
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[](in_RSI,in_stack_ffffffffffffff80);
    Serialize<HashWriter,_CTxOut>((HashWriter *)in_stack_ffffffffffffff78,(CTxOut *)0x8b6716);
  }
  else {
    CTxOut::CTxOut(&local_30);
    Serialize<HashWriter,_CTxOut>((HashWriter *)in_stack_ffffffffffffff78,(CTxOut *)0x8b66bc);
    CTxOut::~CTxOut(in_stack_ffffffffffffff78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeOutput(S &s, unsigned int nOutput) const {
        if (fHashSingle && nOutput != nIn)
            // Do not lock-in the txout payee at other indices as txin
            ::Serialize(s, CTxOut());
        else
            ::Serialize(s, txTo.vout[nOutput]);
    }